

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O0

void __thiscall
tcu::anon_unknown_4::Test::check(Test *this,string *expr,double result,double reference)

{
  ostream *poVar1;
  TestError *this_00;
  char *message;
  ostringstream local_1a0 [8];
  ostringstream oss;
  double reference_local;
  double result_local;
  string *expr_local;
  Test *this_local;
  
  if ((result == reference) && (!NAN(result) && !NAN(reference))) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,(string *)expr);
  poVar1 = std::operator<<(poVar1," returned ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,result);
  poVar1 = std::operator<<(poVar1,", expected ");
  std::ostream::operator<<(poVar1,reference);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::ostringstream::str();
  message = (char *)std::__cxx11::string::c_str();
  TestError::TestError
            (this_00,message,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuFloatFormat.cpp"
             ,0x147);
  __cxa_throw(this_00,&TestError::typeinfo,TestError::~TestError);
}

Assistant:

void Test::check (const string& expr, double result, double reference) const
{
	if (result != reference)
	{
		ostringstream oss;
		oss << expr << " returned " << result << ", expected " << reference;
		TCU_FAIL(oss.str().c_str());
	}
}